

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::MultiReporter::testCasePartialEnded
          (MultiReporter *this,TestCaseStats *testStats,uint64_t partNumber)

{
  size_type sVar1;
  pointer puVar2;
  IEventListener *pIVar3;
  pointer puVar4;
  
  if (((this->super_IEventListener).m_preferences.shouldRedirectStdOut == true) &&
     (this->m_haveNoncapturingReporters == true)) {
    sVar1 = (testStats->stdOut)._M_string_length;
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(testStats->stdOut)._M_dataplus._M_p,sVar1);
      std::ostream::flush();
    }
    sVar1 = (testStats->stdErr)._M_string_length;
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(testStats->stdErr)._M_dataplus._M_p,sVar1);
      std::ostream::flush();
    }
  }
  puVar4 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar4 == puVar2) {
      return;
    }
    pIVar3 = puVar4->m_ptr;
    if (pIVar3 == (IEventListener *)0x0) break;
    (*pIVar3->_vptr_IEventListener[0xf])(pIVar3,testStats,partNumber);
    puVar4 = puVar4 + 1;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
               );
}

Assistant:

void MultiReporter::testCasePartialEnded( TestCaseStats const& testStats,
                                                  uint64_t partNumber ) {
        if ( m_preferences.shouldRedirectStdOut &&
             m_haveNoncapturingReporters ) {
            if ( !testStats.stdOut.empty() ) {
                Catch::cout() << testStats.stdOut << std::flush;
            }
            if ( !testStats.stdErr.empty() ) {
                Catch::cerr() << testStats.stdErr << std::flush;
            }
        }

        for ( auto& reporterish : m_reporterLikes ) {
            reporterish->testCasePartialEnded( testStats, partNumber );
        }
    }